

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int check_password_digest
              (char *method,char *ha1,char *uri,char *nonce,char *nc,char *cnonce,char *qop,
              char *response)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  __int32_t **pp_Var4;
  uint uVar5;
  long lVar6;
  char expected_response [33];
  char ha2 [33];
  
  uVar5 = 0;
  if (response != (char *)0x0 &&
      (qop != (char *)0x0 &&
      ((cnonce != (char *)0x0 && nc != (char *)0x0) &&
      (nonce != (char *)0x0 && method != (char *)0x0)))) {
    sVar3 = strlen(response);
    if (sVar3 == 0x20) {
      lVar6 = 0;
      mg_md5(ha2,method,":",uri,0);
      mg_md5(expected_response,ha1,":",nonce,":",nc,":",cnonce,":",qop,":",ha2,0);
      pp_Var4 = __ctype_tolower_loc();
      do {
        iVar1 = (*pp_Var4)[(byte)response[lVar6]];
        iVar2 = (*pp_Var4)[(byte)expected_response[lVar6]];
        if (response[lVar6] == 0) break;
        lVar6 = lVar6 + 1;
      } while (iVar1 == iVar2);
      uVar5 = (uint)(iVar1 == iVar2);
    }
  }
  return uVar5;
}

Assistant:

static int
check_password_digest(const char *method,
                      const char *ha1,
                      const char *uri,
                      const char *nonce,
                      const char *nc,
                      const char *cnonce,
                      const char *qop,
                      const char *response)
{
	char ha2[32 + 1], expected_response[32 + 1];

	/* Some of the parameters may be NULL */
	if ((method == NULL) || (nonce == NULL) || (nc == NULL) || (cnonce == NULL)
	    || (qop == NULL) || (response == NULL)) {
		return 0;
	}

	/* NOTE(lsm): due to a bug in MSIE, we do not compare the URI */
	if (strlen(response) != 32) {
		return 0;
	}

	mg_md5(ha2, method, ":", uri, NULL);
	mg_md5(expected_response,
	       ha1,
	       ":",
	       nonce,
	       ":",
	       nc,
	       ":",
	       cnonce,
	       ":",
	       qop,
	       ":",
	       ha2,
	       NULL);

	return mg_strcasecmp(response, expected_response) == 0;
}